

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::FunctionStmt::FunctionStmt(FunctionStmt *this,Token *token,int line)

{
  Token local_50;
  int local_1c;
  Token *pTStack_18;
  int line_local;
  Token *token_local;
  FunctionStmt *this_local;
  
  local_1c = line;
  pTStack_18 = token;
  token_local = (Token *)this;
  ::token::Token::Token(&local_50,token);
  ExpressionStmt::ExpressionStmt(&this->super_ExpressionStmt,&local_50,local_1c,FunctionStmtType);
  ::token::Token::~Token(&local_50);
  (this->super_ExpressionStmt).super_Stmt.super_Node._vptr_Node =
       (_func_int **)&PTR__FunctionStmt_0014fae8;
  return;
}

Assistant:

FunctionStmt(Token token, int line)
        :ExpressionStmt(token, line, NodeType::FunctionStmtType){}